

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.h
# Opt level: O3

void __thiscall
ast::Inst_load_store_indirect::~Inst_load_store_indirect(Inst_load_store_indirect *this)

{
  ~Inst_load_store_indirect(this);
  operator_delete(this);
  return;
}

Assistant:

~Inst_load_store_indirect() { delete constant; }